

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

int64_t c_v64_dotp_su8(c_v64 a,c_v64 b)

{
  return (long)(int)((b.u32[0] & 0xff) * (int)a.s8[0] +
                     (b.u16[3] & 0xff) * ((int)((ulong)a >> 0x18) >> 0x18) +
                     (a.s32[0] >> 0x18) * (b.u32[0] >> 0x18) + (a.s32[1] >> 0x18) * (uint)b.u8[7] +
                     ((uint)((ulong)b >> 0x10) & 0xff) * (int)a.s8[2] +
                     (b.u32[1] & 0xff) * ((int)((ulong)a >> 8) >> 0x18) +
                     (b.u32[1] >> 8 & 0xff) * ((int)((ulong)a >> 0x10) >> 0x18) +
                    ((uint)((ulong)b >> 8) & 0xff) * (int)a.s8[1]);
}

Assistant:

SIMD_INLINE int64_t c_v64_dotp_su8(c_v64 a, c_v64 b) {
  return a.s8[7] * b.u8[7] + a.s8[6] * b.u8[6] + a.s8[5] * b.u8[5] +
         a.s8[4] * b.u8[4] + a.s8[3] * b.u8[3] + a.s8[2] * b.u8[2] +
         a.s8[1] * b.u8[1] + a.s8[0] * b.u8[0];
}